

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t CTcTokenizer::tokenize_string(utf8_ptr *p,CTcToken *tok,tok_embed_ctx *ec,int expanding)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  tc_toktyp_t tVar4;
  char *txt;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  tok_embed_ctx *in_RDX;
  CTcToken *in_RSI;
  utf8_ptr *in_RDI;
  bool bVar8;
  int qcnt;
  wchar_t cur;
  char *contents_end;
  char *contents_start;
  int allow_embedding;
  tc_toktyp_t typ;
  int triple;
  wchar_t qu;
  int regex;
  char *start;
  undefined4 in_stack_00000088;
  undefined4 in_stack_ffffffffffffff58;
  wchar_t in_stack_ffffffffffffff5c;
  tok_embed_ctx *in_stack_ffffffffffffff60;
  CTcToken *pCVar9;
  undefined8 in_stack_ffffffffffffff68;
  tok_embed_ctx *in_stack_ffffffffffffff70;
  tc_toktyp_t local_6c;
  tc_toktyp_t local_68;
  tc_toktyp_t local_64;
  tc_toktyp_t local_60;
  char *local_50;
  tc_toktyp_t local_38;
  int local_34;
  wchar_t local_30;
  
  txt = utf8_ptr::getptr(in_RDI);
  wVar1 = utf8_ptr::getch((utf8_ptr *)0x291e78);
  if (wVar1 == L'R') {
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  }
  local_30 = utf8_ptr::getch((utf8_ptr *)0x291ea8);
  utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  local_34 = 0;
  if (((local_30 == L'\"') || (local_30 == L'\'')) &&
     (iVar2 = count_quotes((utf8_ptr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c),
     1 < iVar2)) {
    local_34 = 1;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  }
  if (local_30 == L'\"') {
    local_38 = TOKT_DSTR;
    bVar8 = in_RDX != (tok_embed_ctx *)0x0;
  }
  else if (local_30 == L'\'') {
    local_38 = TOKT_SSTR;
    bVar8 = in_RDX != (tok_embed_ctx *)0x0;
  }
  else if (local_30 == L'>') {
    if (in_RDX == (tok_embed_ctx *)0x0) {
      local_38 = TOKT_INVALID;
      local_30 = L'\"';
    }
    else {
      local_38 = tok_embed_ctx::endtok(in_stack_ffffffffffffff60);
      local_30 = tok_embed_ctx::qu(in_stack_ffffffffffffff60);
      local_34 = tok_embed_ctx::triple(in_stack_ffffffffffffff60);
      tok_embed_ctx::end_expr(in_RDX);
    }
    bVar8 = in_RDX != (tok_embed_ctx *)0x0;
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  }
  else {
    local_38 = TOKT_INVALID;
    local_30 = L'\"';
    bVar8 = false;
  }
  if (wVar1 == L'R') {
    bVar8 = false;
    local_38 = TOKT_RESTR;
  }
  pcVar5 = utf8_ptr::getptr(in_RDI);
LAB_00292030:
  while( true ) {
    while (wVar1 = utf8_ptr::getch((utf8_ptr *)0x29203d), wVar1 == L'\\') {
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
      if ((local_34 == 0) || (wVar1 = utf8_ptr::getch((utf8_ptr *)0x292069), wVar1 != local_30))
      goto LAB_00292352;
      while (wVar1 = utf8_ptr::getch((utf8_ptr *)0x29207e), wVar1 == local_30) {
        utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
      }
    }
    if (((wVar1 == L'<') && (bVar8)) &&
       (wVar3 = utf8_ptr::getch_at((utf8_ptr *)in_stack_ffffffffffffff60,
                                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
       wVar3 == L'<')) {
      if (local_38 == TOKT_DSTR) {
        local_60 = TOKT_DSTR_START;
      }
      else {
        if (local_38 == TOKT_DSTR_END) {
          local_64 = TOKT_DSTR_MID;
        }
        else {
          if (local_38 == TOKT_SSTR) {
            local_68 = TOKT_SSTR_START;
          }
          else {
            if (local_38 == TOKT_SSTR_END) {
              local_6c = TOKT_SSTR_MID;
            }
            else {
              local_6c = local_38;
            }
            local_68 = local_6c;
          }
          local_64 = local_68;
        }
        local_60 = local_64;
      }
      local_38 = local_60;
      tok_embed_ctx::start_expr
                (in_stack_ffffffffffffff70,(wchar_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                 (int)in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      local_50 = utf8_ptr::getptr(in_RDI);
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
      utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
      pcVar6 = utf8_ptr::getptr(in_RDI);
      CTcToken::set_text(in_RSI,txt,(long)pcVar6 - (long)txt);
      goto LAB_00292364;
    }
    if (wVar1 == local_30) break;
    if (wVar1 == L'\0') {
      local_50 = utf8_ptr::getptr(in_RDI);
      if ((*(byte *)G_tok >> 5 & 1) != 0) {
        log_error(0x272a);
      }
      pCVar9 = in_RSI;
      pcVar6 = txt;
      pcVar7 = utf8_ptr::getptr(in_RDI);
      CTcToken::set_text(pCVar9,pcVar6,(long)pcVar7 - (long)txt);
LAB_00292364:
      if ((((*(byte *)G_tok >> 5 & 1) == 0) && (G_tok->string_fp_ != (CVmDataSource *)0x0)) &&
         (pcVar5 != local_50)) {
        CCharmapToLocal::write_file
                  ((CCharmapToLocal *)tok,(CVmDataSource *)ec,
                   (char *)CONCAT44(expanding,in_stack_00000088),(size_t)start);
        (*G_tok->string_fp_->_vptr_CVmDataSource[4])(G_tok->string_fp_,"\n",1);
      }
      CTcToken::settyp(in_RSI,local_38);
      tVar4 = CTcToken::gettyp(in_RSI);
      return tVar4;
    }
LAB_00292352:
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  }
  if (local_34 == 0) {
    local_50 = utf8_ptr::getptr(in_RDI);
    utf8_ptr::inc((utf8_ptr *)in_stack_ffffffffffffff60);
  }
  else {
    iVar2 = count_quotes((utf8_ptr *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    if (iVar2 < 3) {
      utf8_ptr::inc_by((utf8_ptr *)in_stack_ffffffffffffff60,
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      goto LAB_00292030;
    }
    utf8_ptr::inc_by((utf8_ptr *)in_stack_ffffffffffffff60,
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    local_50 = utf8_ptr::getptr(in_RDI);
    utf8_ptr::inc_by((utf8_ptr *)in_stack_ffffffffffffff60,
                     CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  }
  pCVar9 = in_RSI;
  pcVar6 = utf8_ptr::getptr(in_RDI);
  CTcToken::set_text(pCVar9,txt,(long)pcVar6 - (long)txt);
  goto LAB_00292364;
}

Assistant:

tc_toktyp_t CTcTokenizer::tokenize_string(
    utf8_ptr *p, CTcToken *tok, tok_embed_ctx *ec, int expanding)
{
    /* remember where the text starts */
    const char *start = p->getptr();

    /* check for a regex string - R'...' or R"..." */
    int regex = (p->getch() == 'R');
    if (regex)
        p->inc();

    /* note the quote type, for matching later */
    wchar_t qu = p->getch();

    /* skip the quote in the input */
    p->inc();

    /* check for triple quotes */
    int triple = FALSE;
    if ((qu == '"' || qu == '\'') && count_quotes(p, qu) >= 2)
    {
        /* note the triple quotes */
        triple = TRUE;

        /* skip the open quotes */
        p->inc();
        p->inc();
    }

    /* determine the token type based on the quote type */
    tc_toktyp_t typ;
    int allow_embedding;
    switch(qu)
    {
    case '\'':
        /* single-quoted string */
        typ = TOKT_SSTR;
        allow_embedding = (ec != 0);
        break;

    case '"':
        /* regular double-quoted string */
        typ = TOKT_DSTR;
        allow_embedding = (ec != 0);
        break;

    case '>':
        /* get the ending type for the embedding */
        if (ec != 0)
        {
            /* return to the enclosing string context */
            typ = ec->endtok();
            qu = ec->qu();
            triple = ec->triple();

            /* allow more embeddings */
            allow_embedding = TRUE;

            /* exit the expression context */
            ec->end_expr();
        }
        else
        {
            /* we can only finish an embedding if we were already in one */
            typ = TOKT_INVALID;
            qu = '"';
            allow_embedding = FALSE;
        }

        /* skip the extra '>' character */
        p->inc();
        break;

    default:
        /* anything else is invalid */
        typ = TOKT_INVALID;
        qu = '"';
        allow_embedding = FALSE;
        break;
    }

    /* if it's a regex string, it has special handling */
    if (regex)
    {
        /* embeddings aren't allowed in regex strings */
        allow_embedding = FALSE;

        /* the token type is 'regex string' */
        typ = TOKT_RESTR;
    }

    /* this is where the string's contents start */
    const char *contents_start = p->getptr();

    /* we don't know where it ends yet */
    const char *contents_end;

    /* scan the string */
    for (;;)
    {
        /* get the current character */
        wchar_t cur = p->getch();

        /* see what we have */
        if (cur == '\\')
        {
            /* escape sequence - skip an extra character */
            p->inc();

            /* 
             *   if we're in a triple-quoted string, and this matches the
             *   quote type, a single '\' escapes all consecutive quotes 
             */
            if (triple && p->getch() == qu)
            {
                /* skip the whole run of quotes */
                for ( ; p->getch() == qu ; p->inc()) ;

                /* take it from the top, as we've already skipped them all */
                continue;
            }
        }
        else if (cur == '<' && allow_embedding && p->getch_at(1) == '<')
        {
            /* 
             *   it's the start of an embedded expression - return the
             *   appropriate embedded string part type 
             */
            typ = (typ == TOKT_DSTR ? TOKT_DSTR_START :
                   typ == TOKT_DSTR_END ? TOKT_DSTR_MID :
                   typ == TOKT_SSTR ? TOKT_SSTR_START :
                   typ == TOKT_SSTR_END ? TOKT_SSTR_MID :
                   typ);

            /* remember that we're in an embedding in the token stream */
            ec->start_expr(qu, triple, !expanding);

            /* this is where the contents end */
            contents_end = p->getptr();

            /* skip the two embedding characters */
            p->inc();
            p->inc();

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);

            /* done */
            break;
        }
        else if (cur == qu)
        {
            /* 
             *   if we're in a triple-quoted string, it ends at a triple
             *   quote, except that any additional consecutive quotes go
             *   inside the string rather than outside 
             */
            if (triple)
            {
                /* we need at least three quotes in a row to end the string */
                int qcnt = count_quotes(p, qu);
                if (qcnt >= 3)
                {
                    /* the contents include any quotes before the last 3 */
                    p->inc_by(qcnt - 3);
                    contents_end = p->getptr();

                    /* skip the three close quotes */
                    p->inc_by(3);
                }
                else
                {
                    /* it's not ending; skip the quotes and carry on */
                    p->inc_by(qcnt);
                    continue;
                }
            }
            else
            {
                /* note where the string ends */
                contents_end = p->getptr();

                /* skip the closing quote */
                p->inc();
            }

            /* we're done - set the text in the token */
            tok->set_text(start, p->getptr() - start);
            
            /* done */
            break;
        }
        else if (cur == '\0')
        {
            /* this is where the contents end */
            contents_end = p->getptr();

            /* 
             *   We have an unterminated string.  If we're evaluating a
             *   preprocessor constant expression, log an error; otherwise
             *   let it go for now, since we'll catch the error during the
             *   normal tokenizing pass for parsing. 
             */
            if (G_tok->in_pp_expr_)
                log_error(TCERR_PP_UNTERM_STRING);

            /* set the partial text */
            tok->set_text(start, p->getptr() - start);
            
            /* end of line - return with the string unfinished */
            break;
        }

        /* skip this character of input */
        p->inc();
    }

    /* 
     *   if we're not in preprocessor mode, and we're saving string text,
     *   write the string to the string text output file 
     */
    if (!G_tok->in_pp_expr_ && G_tok->string_fp_ != 0
        && contents_start != contents_end)
    {
        /* write the line, translating back to the source character set */
        G_tok->string_fp_map_
            ->write_file(G_tok->string_fp_, contents_start,
                         (size_t)(contents_end - contents_start));

        /* add a newline */
        G_tok->string_fp_->write("\n", 1);
    }

    /* set the type in the token */
    tok->settyp(typ);

    /* return the token type */
    return tok->gettyp();
}